

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86ATTInstPrinter.c
# Opt level: O1

void printRoundingControl(MCInst *MI,uint Op,SStream *O)

{
  uint uVar1;
  MCOperand *op;
  int64_t iVar2;
  
  op = MCInst_getOperand(MI,Op);
  iVar2 = MCOperand_getImm(op);
  uVar1 = (uint)iVar2 & 3;
  SStream_concat0(O,&DAT_0045ec60 + *(int *)(&DAT_0045ec60 + (ulong)uVar1 * 4));
  op_addAvxSae(MI);
  op_addAvxRoundingMode(MI,uVar1 + 1);
  return;
}

Assistant:

static void printRoundingControl(MCInst *MI, unsigned Op, SStream *O)
{
	int64_t Imm = MCOperand_getImm(MCInst_getOperand(MI, Op)) & 0x3;
	switch (Imm) {
		case 0: SStream_concat0(O, "{rn-sae}"); op_addAvxSae(MI); op_addAvxRoundingMode(MI, X86_AVX_RM_RN); break;
		case 1: SStream_concat0(O, "{rd-sae}"); op_addAvxSae(MI); op_addAvxRoundingMode(MI, X86_AVX_RM_RD); break;
		case 2: SStream_concat0(O, "{ru-sae}"); op_addAvxSae(MI); op_addAvxRoundingMode(MI, X86_AVX_RM_RU); break;
		case 3: SStream_concat0(O, "{rz-sae}"); op_addAvxSae(MI); op_addAvxRoundingMode(MI, X86_AVX_RM_RZ); break;
		default: break;	// nev0er reach
	}
}